

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t iconv_strncat_in_locale(archive_string *as,void *_p,size_t length,archive_string_conv *sc)

{
  wchar_t wVar1;
  iconv_t __cd;
  uchar *p;
  archive_string *paVar2;
  size_t sVar3;
  int *piVar4;
  wchar_t wVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  char *outp;
  size_t remaining;
  char *itp;
  char *local_78;
  ulong local_70;
  char *local_68;
  ulong local_60;
  wchar_t local_54;
  ulong local_50;
  archive_string_conv *local_48;
  char *local_40;
  ulong local_38;
  
  wVar1 = sc->flag;
  uVar8 = (ulong)((wVar1 & 0x1400U) != 0);
  uVar7 = 2 - (ulong)((wVar1 & 0x2800U) == 0);
  local_68 = (char *)_p;
  paVar2 = archive_string_ensure(as,length * 2 + as->length + uVar8 + 1);
  wVar5 = L'\xffffffff';
  if (paVar2 != (archive_string *)0x0) {
    local_50 = ~uVar8;
    local_38 = (ulong)((wVar1 & 0x1400U) != 0);
    __cd = sc->cd;
    local_40 = local_68;
    local_78 = as->s + as->length;
    local_70 = (local_50 - as->length) + as->buffer_length;
    local_68 = (char *)0x0;
    local_60 = length;
    local_54 = wVar1;
    local_48 = sc;
    do {
      if (local_60 < uVar7) goto LAB_0010e3cb;
      sVar3 = iconv(__cd,&local_40,&local_60,&local_78,&local_70);
      iVar6 = 3;
      if (sVar3 == 0xffffffffffffffff) {
        piVar4 = __errno_location();
        if ((*piVar4 == 0x54) || (*piVar4 == 0x16)) {
          if ((local_48->flag & 0x1500U) == 0) {
            *local_78 = '?';
            local_70 = local_70 - 1;
            local_78 = local_78 + 1;
          }
          else {
            uVar8 = (ulong)(((uint)local_48->flag >> 8 & 1) != 0) + 2;
            if (local_70 < uVar8) {
              as->length = (long)local_78 - (long)as->s;
              paVar2 = archive_string_ensure
                                 (as,as->buffer_length + uVar8 +
                                     (local_60 << ((byte)local_38 & 0x3f)));
              if (paVar2 == (archive_string *)0x0) {
                iVar6 = 1;
                goto LAB_0010e3af;
              }
              local_78 = as->s + as->length;
              local_70 = (local_50 - as->length) + as->buffer_length;
            }
            if (((uint)local_48->flag >> 8 & 1) == 0) {
              if (((uint)local_48->flag >> 10 & 1) == 0) {
                local_78[0] = -3;
                local_78[1] = -1;
              }
              else {
                local_78[0] = -1;
                local_78[1] = -3;
              }
            }
            else {
              local_78[2] = -0x43;
              local_78[0] = -0x11;
              local_78[1] = -0x41;
            }
            local_70 = local_70 - uVar8;
            local_78 = local_78 + uVar8;
          }
          local_40 = local_40 + uVar7;
          local_60 = local_60 - uVar7;
          iVar6 = 0;
          local_68 = (char *)0xffffffff;
        }
        else {
          as->length = (long)local_78 - (long)as->s;
          paVar2 = archive_string_ensure(as,local_60 * 2 + as->buffer_length);
          if (paVar2 == (archive_string *)0x0) {
            iVar6 = 1;
          }
          else {
            local_78 = as->s + as->length;
            local_70 = (local_50 - as->length) + as->buffer_length;
            iVar6 = 0;
          }
        }
      }
LAB_0010e3af:
    } while (iVar6 == 0);
    if (iVar6 == 3) {
LAB_0010e3cb:
      as->length = (long)local_78 - (long)as->s;
      *local_78 = '\0';
      if ((local_54 & 0x1400U) != 0) {
        as->s[as->length + 1] = '\0';
      }
      wVar5 = (wchar_t)local_68;
    }
    else {
      wVar5 = L'\xffffffff';
    }
  }
  return wVar5;
}

Assistant:

static int
iconv_strncat_in_locale(struct archive_string *as, const void *_p,
    size_t length, struct archive_string_conv *sc)
{
	ICONV_CONST char *itp;
	size_t remaining;
	iconv_t cd;
	char *outp;
	size_t avail, bs;
	int return_value = 0; /* success */
	int to_size, from_size;

	if (sc->flag & SCONV_TO_UTF16)
		to_size = 2;
	else
		to_size = 1;
	if (sc->flag & SCONV_FROM_UTF16)
		from_size = 2;
	else
		from_size = 1;

	if (archive_string_ensure(as, as->length + length*2+to_size) == NULL)
		return (-1);

	cd = sc->cd;
	itp = (char *)(uintptr_t)_p;
	remaining = length;
	outp = as->s + as->length;
	avail = as->buffer_length - as->length - to_size;
	while (remaining >= (size_t)from_size) {
		size_t result = iconv(cd, &itp, &remaining, &outp, &avail);

		if (result != (size_t)-1)
			break; /* Conversion completed. */

		if (errno == EILSEQ || errno == EINVAL) {
			/*
		 	 * If an output charset is UTF-8 or UTF-16BE/LE,
			 * unknown character should be U+FFFD
			 * (replacement character).
			 */
			if (sc->flag & (SCONV_TO_UTF8 | SCONV_TO_UTF16)) {
				size_t rbytes;
				if (sc->flag & SCONV_TO_UTF8)
					rbytes = sizeof(utf8_replacement_char);
				else
					rbytes = 2;

				if (avail < rbytes) {
					as->length = outp - as->s;
					bs = as->buffer_length +
					    (remaining * to_size) + rbytes;
					if (NULL ==
					    archive_string_ensure(as, bs))
						return (-1);
					outp = as->s + as->length;
					avail = as->buffer_length
					    - as->length - to_size;
				}
				if (sc->flag & SCONV_TO_UTF8)
					memcpy(outp, utf8_replacement_char, sizeof(utf8_replacement_char));
				else if (sc->flag & SCONV_TO_UTF16BE)
					archive_be16enc(outp, UNICODE_R_CHAR);
				else
					archive_le16enc(outp, UNICODE_R_CHAR);
				outp += rbytes;
				avail -= rbytes;
			} else {
				/* Skip the illegal input bytes. */
				*outp++ = '?';
				avail--;
			}
			itp += from_size;
			remaining -= from_size;
			return_value = -1; /* failure */
		} else {
			/* E2BIG no output buffer,
			 * Increase an output buffer.  */
			as->length = outp - as->s;
			bs = as->buffer_length + remaining * 2;
			if (NULL == archive_string_ensure(as, bs))
				return (-1);
			outp = as->s + as->length;
			avail = as->buffer_length - as->length - to_size;
		}
	}
	as->length = outp - as->s;
	as->s[as->length] = 0;
	if (to_size == 2)
		as->s[as->length+1] = 0;
	return (return_value);
}